

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device5.c
# Opt level: O0

void device5(void *arg)

{
  int sock;
  int sock_00;
  int iVar1;
  bool bVar2;
  int dev1;
  int dev0;
  int rc;
  void *arg_local;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                          ,0x2b,2,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                 ,0x2c,sock,socket_address_h);
  sock_00 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                             ,0x2d,2,0x30);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                 ,0x2e,sock_00,socket_address_i);
  iVar1 = nn_device(sock,sock_00);
  bVar2 = false;
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    bVar2 = iVar1 == 0x9523dfd;
  }
  if (!bVar2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
            ,0x32);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                  ,0x35,sock);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device5.c"
                  ,0x36,sock_00);
  return;
}

Assistant:

void device5 (NN_UNUSED void *arg)
{
    int rc;
    int dev0;
    int dev1;

    /*  Intialise the device sockets. */
    dev0 = test_socket (AF_SP_RAW, NN_REP);
    test_bind (dev0, socket_address_h);
    dev1 = test_socket (AF_SP_RAW, NN_REQ);
    test_bind (dev1, socket_address_i);

    /*  Run the device. */
    rc = nn_device (dev0, dev1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (dev0);
    test_close (dev1);
}